

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.h
# Opt level: O2

void __thiscall
CMU462::HDRImageBuffer::toColor
          (HDRImageBuffer *this,ImageBuffer *target,size_t x0,size_t y0,size_t x1,size_t y1)

{
  pointer pSVar1;
  long lVar2;
  size_t x;
  size_t x_00;
  long lVar3;
  long lVar4;
  size_t y;
  float fVar5;
  float fVar6;
  Color local_68;
  long local_58;
  size_t local_50;
  ulong local_48;
  ImageBuffer *local_40;
  size_t local_38;
  
  lVar2 = y0 * 0xc;
  local_58 = x0 * 0xc + 8;
  local_50 = x0;
  local_48 = y1;
  local_40 = target;
  local_38 = x1;
  while( true ) {
    x_00 = local_50;
    lVar3 = local_58;
    if (local_48 <= y0) break;
    for (; x_00 < local_38; x_00 = x_00 + 1) {
      lVar4 = this->w * lVar2;
      pSVar1 = (this->data).super__Vector_base<CMU462::Spectrum,_std::allocator<CMU462::Spectrum>_>.
               _M_impl.super__Vector_impl_data._M_start;
      fVar5 = powf(*(float *)((long)pSVar1 + lVar3 + -8 + lVar4) * 1.4142135,0.45454544);
      fVar6 = powf(*(float *)((long)pSVar1 + lVar3 + -4 + lVar4) * 1.4142135,0.45454544);
      local_68.b = powf(*(float *)((long)&pSVar1->r + lVar3 + lVar4) * 1.4142135,0.45454544);
      local_68.a = 1.0;
      local_68.r = fVar5;
      local_68.g = fVar6;
      ImageBuffer::update_pixel(local_40,&local_68,x_00,y0);
      lVar3 = lVar3 + 0xc;
    }
    y0 = y0 + 1;
    lVar2 = lVar2 + 0xc;
  }
  return;
}

Assistant:

void toColor(ImageBuffer& target, size_t x0, size_t y0, size_t x1,
               size_t y1) {
    float gamma = 2.2f;
    float level = 1.0f;
    float one_over_gamma = 1.0f / gamma;
    float exposure = sqrt(pow(2, level));
    for (size_t y = y0; y < y1; ++y) {
      for (size_t x = x0; x < x1; ++x) {
        const Spectrum& s = data[x + y * w];
        float r = pow(s.r * exposure, one_over_gamma);
        float g = pow(s.g * exposure, one_over_gamma);
        float b = pow(s.b * exposure, one_over_gamma);
        target.update_pixel(Color(r, g, b, 1.0), x, y);
      }
    }
  }